

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_light.cpp
# Opt level: O1

Light_SampleRes *
embree::PointLight_sample
          (Light_SampleRes *__return_storage_ptr__,Light *super,DifferentialGeometry *dg,Vec2f *s)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  float fVar5;
  float fVar7;
  float fVar8;
  float fVar9;
  undefined1 auVar6 [16];
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  undefined1 auVar15 [12];
  undefined1 auVar16 [12];
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  float fVar30;
  float fVar31;
  float fVar32;
  vfloat4 a;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  float fVar35;
  float fVar36;
  undefined1 auVar20 [16];
  
  fVar10 = (float)super[4].type - (dg->P).field_0.m128[0];
  fVar11 = (float)super[5].type - (dg->P).field_0.m128[1];
  fVar12 = (float)super[6].type - (dg->P).field_0.m128[2];
  fVar13 = (float)super[7].type - (dg->P).field_0.m128[3];
  fVar7 = fVar11 * fVar11;
  fVar8 = fVar12 * fVar12;
  fVar9 = fVar13 * fVar13;
  fVar17 = fVar7 + fVar10 * fVar10 + fVar8;
  auVar20._0_8_ = CONCAT44(fVar7 + fVar7 + fVar9,fVar17);
  auVar20._8_4_ = fVar7 + fVar8 + fVar8;
  auVar20._12_4_ = fVar7 + fVar9 + fVar9;
  auVar6._8_4_ = auVar20._8_4_;
  auVar6._0_8_ = auVar20._0_8_;
  auVar6._12_4_ = auVar20._12_4_;
  auVar6 = rsqrtss(auVar6,auVar20);
  fVar7 = auVar6._0_4_;
  fVar5 = fVar7 * fVar7 * fVar17 * -0.5 * fVar7 + fVar7 * 1.5;
  (__return_storage_ptr__->dir).field_0.m128[0] = fVar5 * fVar10;
  (__return_storage_ptr__->dir).field_0.m128[1] = fVar5 * fVar11;
  (__return_storage_ptr__->dir).field_0.m128[2] = fVar5 * fVar12;
  (__return_storage_ptr__->dir).field_0.m128[3] = fVar5 * fVar13;
  __return_storage_ptr__->dist = fVar17 * fVar5;
  __return_storage_ptr__->pdf = INFINITY;
  fVar10 = fVar5 * fVar5;
  fVar7 = (float)super[9].type;
  fVar8 = (float)super[10].type;
  fVar9 = (float)super[0xb].type;
  (__return_storage_ptr__->weight).field_0.m128[0] = fVar10 * (float)super[8].type;
  (__return_storage_ptr__->weight).field_0.m128[1] = fVar10 * fVar7;
  (__return_storage_ptr__->weight).field_0.m128[2] = fVar10 * fVar8;
  (__return_storage_ptr__->weight).field_0.m128[3] = fVar10 * fVar9;
  if ((0.0 < (float)super[0xc].type) && (fVar7 = (float)super[0xc].type * fVar5, 0.005 < fVar7)) {
    if (1.0 <= fVar7) {
      fVar7 = (s->field_0).field_0.x;
      fVar8 = (s->field_0).field_0.y;
      if (fVar8 < 0.0) {
        fVar9 = sqrtf(fVar8);
      }
      else {
        fVar9 = SQRT(fVar8);
      }
      fVar7 = fVar7 * 6.2831855;
      fVar8 = 1.0 - fVar8;
      if (fVar8 < 0.0) {
        fVar8 = sqrtf(fVar8);
      }
      else {
        fVar8 = SQRT(fVar8);
      }
      fVar5 = sinf(fVar7);
      fVar10 = cosf(fVar7);
      fVar10 = fVar10 * fVar8;
      fVar5 = fVar5 * fVar8;
      fVar7 = (dg->Ns).field_0.m128[0];
      fVar8 = (dg->Ns).field_0.m128[2];
      fVar11 = -(dg->Ns).field_0.m128[1];
      fVar12 = -fVar8;
      auVar16._8_4_ = 0xffffffff;
      auVar16._0_8_ = 0xffffffffffffffff;
      if (fVar11 * fVar11 + fVar8 * fVar8 + 0.0 <= fVar7 * fVar7 + fVar12 * fVar12 + 0.0) {
        auVar16 = SUB1612((undefined1  [16])0x0,0);
      }
      fVar8 = (float)((uint)fVar8 & auVar16._4_4_);
      fVar12 = (float)(~auVar16._0_4_ & (uint)fVar12);
      fVar30 = (float)(~auVar16._8_4_ & (uint)fVar7 | (uint)fVar11 & auVar16._8_4_);
      fVar7 = fVar8 * fVar8;
      fVar11 = fVar30 * fVar30;
      fVar13 = fVar7 + fVar12 * fVar12 + fVar11;
      fVar17 = fVar7 + fVar7 + 0.0;
      fVar11 = fVar7 + fVar11 + fVar11;
      fVar7 = fVar7 + 0.0 + 0.0;
      auVar34._4_4_ = fVar17;
      auVar34._0_4_ = fVar13;
      auVar34._8_4_ = fVar11;
      auVar34._12_4_ = fVar7;
      auVar2._4_4_ = fVar17;
      auVar2._0_4_ = fVar13;
      auVar2._8_4_ = fVar11;
      auVar2._12_4_ = fVar7;
      auVar6 = rsqrtss(auVar34,auVar2);
      fVar7 = auVar6._0_4_;
      fVar31 = fVar7 * 1.5 - fVar7 * fVar7 * fVar13 * 0.5 * fVar7;
      fVar12 = fVar31 * fVar12;
      fVar8 = fVar31 * fVar8;
      fVar30 = fVar31 * fVar30;
      fVar31 = fVar31 * 0.0;
      fVar7 = (dg->Ns).field_0.m128[0];
      fVar11 = (dg->Ns).field_0.m128[1];
      fVar13 = (dg->Ns).field_0.m128[2];
      fVar17 = (dg->Ns).field_0.m128[3];
      fVar32 = fVar8 * fVar7 - fVar11 * fVar12;
      fVar24 = fVar30 * fVar11 - fVar13 * fVar8;
      fVar25 = fVar12 * fVar13 - fVar7 * fVar30;
      fVar19 = fVar31 * fVar17 - fVar17 * fVar31;
      fVar14 = fVar24 * fVar24;
      fVar18 = fVar25 * fVar25;
      fVar23 = fVar19 * fVar19;
      fVar26 = fVar18 + fVar14 + fVar32 * fVar32;
      fVar27 = fVar23 + fVar14 + fVar14;
      fVar18 = fVar18 + fVar14 + fVar18;
      fVar23 = fVar23 + fVar14 + fVar23;
      auVar22._4_4_ = fVar27;
      auVar22._0_4_ = fVar26;
      auVar22._8_4_ = fVar18;
      auVar22._12_4_ = fVar23;
      auVar4._4_4_ = fVar27;
      auVar4._0_4_ = fVar26;
      auVar4._8_4_ = fVar18;
      auVar4._12_4_ = fVar23;
      auVar6 = rsqrtss(auVar22,auVar4);
      fVar14 = auVar6._0_4_;
      fVar14 = fVar14 * 1.5 - fVar14 * fVar14 * fVar26 * 0.5 * fVar14;
      (__return_storage_ptr__->dir).field_0.m128[0] =
           fVar10 * fVar12 + fVar9 * fVar7 + fVar5 * fVar14 * fVar24;
      (__return_storage_ptr__->dir).field_0.m128[1] =
           fVar10 * fVar8 + fVar9 * fVar11 + fVar5 * fVar14 * fVar25;
      (__return_storage_ptr__->dir).field_0.m128[2] =
           fVar10 * fVar30 + fVar9 * fVar13 + fVar5 * fVar14 * fVar32;
      (__return_storage_ptr__->dir).field_0.m128[3] =
           fVar10 * fVar31 + fVar9 * fVar17 + fVar5 * fVar14 * fVar19;
      __return_storage_ptr__->pdf = fVar9 / 3.1415927;
      fVar7 = (float)super[0xc].type;
      fVar8 = fVar7 * fVar7;
      auVar6 = rcpss(ZEXT416((uint)fVar8),ZEXT416((uint)fVar8));
      fVar10 = (2.0 - fVar8 * auVar6._0_4_) * auVar6._0_4_;
      fVar8 = (float)super[9].type;
      fVar9 = (float)super[10].type;
      fVar5 = (float)super[0xb].type;
      (__return_storage_ptr__->weight).field_0.m128[0] = fVar10 * (float)super[8].type;
      (__return_storage_ptr__->weight).field_0.m128[1] = fVar10 * fVar8;
      (__return_storage_ptr__->weight).field_0.m128[2] = fVar10 * fVar9;
      (__return_storage_ptr__->weight).field_0.m128[3] = fVar10 * fVar5;
    }
    else {
      fVar7 = 1.0 - fVar7 * fVar7;
      if (fVar7 < 0.0) {
        fVar7 = sqrtf(fVar7);
      }
      else {
        fVar7 = SQRT(fVar7);
      }
      fVar9 = (s->field_0).field_0.x * 6.2831855;
      fVar10 = 1.0 - (s->field_0).field_0.y * (1.0 - fVar7);
      fVar11 = 1.0 - fVar10 * fVar10;
      fVar8 = fVar11;
      if (fVar11 <= 0.0) {
        fVar8 = 0.0;
      }
      if (fVar8 < 0.0) {
        fVar8 = sqrtf(fVar8);
      }
      else {
        fVar8 = SQRT(fVar8);
      }
      fVar12 = sinf(fVar9);
      fVar13 = cosf(fVar9);
      fVar13 = fVar13 * fVar8;
      fVar12 = fVar12 * fVar8;
      fVar8 = (__return_storage_ptr__->dir).field_0.m128[0];
      fVar9 = (__return_storage_ptr__->dir).field_0.m128[2];
      fVar14 = -(__return_storage_ptr__->dir).field_0.m128[1];
      fVar30 = -fVar9;
      auVar15._8_4_ = 0xffffffff;
      auVar15._0_8_ = 0xffffffffffffffff;
      if (fVar14 * fVar14 + fVar9 * fVar9 + 0.0 <= fVar8 * fVar8 + fVar30 * fVar30 + 0.0) {
        auVar15 = SUB1612((undefined1  [16])0x0,0);
      }
      fVar9 = (float)((uint)fVar9 & auVar15._4_4_);
      fVar30 = (float)(~auVar15._0_4_ & (uint)fVar30);
      fVar25 = (float)(~auVar15._8_4_ & (uint)fVar8 | (uint)fVar14 & auVar15._8_4_);
      fVar8 = fVar9 * fVar9;
      fVar14 = fVar25 * fVar25;
      fVar31 = fVar8 + fVar30 * fVar30 + fVar14;
      fVar32 = fVar8 + fVar8 + 0.0;
      fVar14 = fVar8 + fVar14 + fVar14;
      fVar8 = fVar8 + 0.0 + 0.0;
      auVar33._4_4_ = fVar32;
      auVar33._0_4_ = fVar31;
      auVar33._8_4_ = fVar14;
      auVar33._12_4_ = fVar8;
      auVar1._4_4_ = fVar32;
      auVar1._0_4_ = fVar31;
      auVar1._8_4_ = fVar14;
      auVar1._12_4_ = fVar8;
      auVar6 = rsqrtss(auVar33,auVar1);
      fVar8 = auVar6._0_4_;
      fVar18 = fVar8 * 1.5 - fVar8 * fVar8 * fVar31 * 0.5 * fVar8;
      fVar30 = fVar18 * fVar30;
      fVar9 = fVar18 * fVar9;
      fVar25 = fVar18 * fVar25;
      fVar18 = fVar18 * 0.0;
      fVar8 = (__return_storage_ptr__->dir).field_0.m128[0];
      fVar14 = (__return_storage_ptr__->dir).field_0.m128[1];
      fVar31 = (__return_storage_ptr__->dir).field_0.m128[2];
      fVar32 = (__return_storage_ptr__->dir).field_0.m128[3];
      fVar19 = fVar9 * fVar8 - fVar14 * fVar30;
      fVar23 = fVar25 * fVar14 - fVar31 * fVar9;
      fVar26 = fVar30 * fVar31 - fVar8 * fVar25;
      fVar28 = fVar18 * fVar32 - fVar32 * fVar18;
      fVar24 = fVar23 * fVar23;
      fVar27 = fVar26 * fVar26;
      fVar29 = fVar28 * fVar28;
      fVar35 = fVar27 + fVar24 + fVar19 * fVar19;
      fVar36 = fVar29 + fVar24 + fVar24;
      fVar27 = fVar27 + fVar24 + fVar27;
      fVar29 = fVar29 + fVar24 + fVar29;
      auVar21._4_4_ = fVar36;
      auVar21._0_4_ = fVar35;
      auVar21._8_4_ = fVar27;
      auVar21._12_4_ = fVar29;
      auVar3._4_4_ = fVar36;
      auVar3._0_4_ = fVar35;
      auVar3._8_4_ = fVar27;
      auVar3._12_4_ = fVar29;
      auVar6 = rsqrtss(auVar21,auVar3);
      fVar24 = auVar6._0_4_;
      fVar24 = fVar24 * 1.5 - fVar24 * fVar24 * fVar35 * 0.5 * fVar24;
      (__return_storage_ptr__->dir).field_0.m128[0] =
           fVar13 * fVar30 + fVar10 * fVar8 + fVar12 * fVar24 * fVar23;
      (__return_storage_ptr__->dir).field_0.m128[1] =
           fVar13 * fVar9 + fVar10 * fVar14 + fVar12 * fVar24 * fVar26;
      (__return_storage_ptr__->dir).field_0.m128[2] =
           fVar13 * fVar25 + fVar10 * fVar31 + fVar12 * fVar24 * fVar19;
      (__return_storage_ptr__->dir).field_0.m128[3] =
           fVar13 * fVar18 + fVar10 * fVar32 + fVar12 * fVar24 * fVar28;
      fVar7 = (1.0 - fVar7) * 6.2831855;
      auVar6 = rcpss(ZEXT416((uint)fVar7),ZEXT416((uint)fVar7));
      __return_storage_ptr__->pdf = (2.0 - fVar7 * auVar6._0_4_) * auVar6._0_4_;
      fVar7 = (float)super[0xc].type * (float)super[0xc].type - fVar11 * fVar17;
      if (fVar7 < 0.0) {
        fVar7 = sqrtf(fVar7);
      }
      else {
        fVar7 = SQRT(fVar7);
      }
      fVar7 = fVar10 * fVar17 * fVar5 - fVar7;
    }
    __return_storage_ptr__->dist = fVar7;
  }
  return __return_storage_ptr__;
}

Assistant:

SYCL_EXTERNAL Light_SampleRes PointLight_sample(const Light* super,
                                                               const DifferentialGeometry& dg,
                                                               const Vec2f& s)
{
  const PointLight* self = (PointLight*)super;
  Light_SampleRes res;

  // extant light vector from the hit point
  const Vec3fa dir = self->position - dg.P;
  const float dist2 = dot(dir, dir);
  const float invdist = rsqrt(dist2);

  // normalized light vector
  res.dir = dir * invdist;
  res.dist = dist2 * invdist;

  res.pdf = inf; // per default we always take this res

  // convert from power to radiance by attenuating by distance^2
  res.weight = self->power * sqr(invdist);
  const float sinTheta = self->radius * invdist;

  if ((self->radius > 0.f) & (sinTheta > 0.005f)) {
    // res surface of sphere as seen by hit point -> cone of directions
    // for very small cones treat as point light, because float precision is not good enough
    if (sinTheta < 1.f) {
      const float cosTheta = sqrt(1.f - sinTheta * sinTheta);
      const Vec3fa localDir = uniformSampleCone(cosTheta, s);
      res.dir = frame(res.dir) * localDir;
      res.pdf = uniformSampleConePDF(cosTheta);
      const float c = localDir.z;
      res.dist = c*res.dist - sqrt(sqr(self->radius) - (1.f - c*c) * dist2);
      // TODO scale radiance by actual distance
    } else { // inside sphere
      const Vec3fa localDir = cosineSampleHemisphere(s);
      res.dir = frame(dg.Ns) * localDir;
      res.pdf = cosineSampleHemispherePDF(localDir);
      // TODO:
      res.weight = self->power * rcp(sqr(self->radius));
      res.dist = self->radius;
    }
  }

  return res;
}